

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying::~IfcStructuralLinearActionVarying
          (IfcStructuralLinearActionVarying *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
              super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x34];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x35];
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x37];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.field_0x100 = vtt[0x38];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.field_0x138 = vtt[0x39];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x178 =
       vtt[0x3a];
  *(void **)&(this->super_IfcStructuralLinearAction).field_0x1a8 = vtt[0x3b];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                   *)&this->SubsequentAppliedLoads);
  IfcStructuralLinearAction::~IfcStructuralLinearAction
            (&this->super_IfcStructuralLinearAction,vtt + 1);
  return;
}

Assistant:

IfcStructuralLinearActionVarying() : Object("IfcStructuralLinearActionVarying") {}